

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

char * jsonnet_evaluate_snippet_multi(JsonnetVm *vm,char *filename,char *snippet,int *error)

{
  char *pcVar1;
  
  pcVar1 = jsonnet_evaluate_snippet_aux(vm,filename,snippet,error,MULTI);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_snippet_multi(JsonnetVm *vm, const char *filename, const char *snippet,
                                     int *error)
{
    TRY
        return jsonnet_evaluate_snippet_aux(vm, filename, snippet, error, MULTI);
    CATCH("jsonnet_evaluate_snippet_multi")
    return nullptr;  // Never happens.
}